

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImGuiWindow *pIVar1;
  ImU32 IVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  ImU32 IVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ImVec2 pos1;
  float local_198;
  float fStack_194;
  uint local_180;
  ImVec2 pos0;
  float local_138;
  float local_118;
  float local_f8;
  float local_98;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    IVar13 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_198 = graph_size.x;
    fStack_194 = graph_size.y;
    if ((local_198 == 0.0) && (!NAN(local_198))) {
      local_198 = CalcItemWidth();
    }
    fVar10 = IVar13.x;
    if ((fStack_194 != 0.0) || (NAN(fStack_194))) {
      fVar16 = (pIVar3->Style).FramePadding.y;
    }
    else {
      fVar16 = (pIVar3->Style).FramePadding.y;
      fStack_194 = fVar16 + fVar16 + IVar13.y;
    }
    IVar13 = (pIVar1->DC).CursorPos;
    fVar20 = IVar13.x;
    fVar22 = IVar13.y;
    fVar17 = local_198 + fVar20;
    fStack_194 = fStack_194 + fVar22;
    frame_bb.Max.y = fStack_194;
    frame_bb.Max.x = fVar17;
    local_98 = (pIVar3->Style).FramePadding.x;
    fVar19 = fVar20 + local_98;
    fVar18 = fVar16 + fVar22;
    local_98 = fVar17 - local_98;
    fVar14 = 0.0;
    if (0.0 < fVar10) {
      fVar14 = (pIVar3->Style).ItemInnerSpacing.x + fVar10;
    }
    total_bb.Max.y = fStack_194 + 0.0;
    total_bb.Max.x = fVar14 + fVar17;
    inner_bb.Min.x = fVar19;
    inner_bb.Min.y = fVar18;
    inner_bb.Max.x = local_98;
    inner_bb.Max.y = fStack_194 - fVar16;
    frame_bb.Min = IVar13;
    total_bb.Min = IVar13;
    ItemSize(&total_bb,fVar16);
    bVar4 = ItemAdd(&total_bb,(ImGuiID *)0x0);
    if (bVar4) {
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_138 = scale_max, local_118 = scale_min, scale_max == 3.4028235e+38 &&
          (!NAN(scale_max))))) {
        iVar7 = 0;
        iVar8 = 0;
        if (0 < values_count) {
          iVar8 = values_count;
        }
        fVar14 = 3.4028235e+38;
        fVar15 = -3.4028235e+38;
        for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
          fVar11 = (*values_getter)(data,iVar7);
          if (fVar11 <= fVar14) {
            fVar14 = fVar11;
          }
          fVar15 = (float)(-(uint)(fVar11 <= fVar15) & (uint)fVar15 |
                          ~-(uint)(fVar11 <= fVar15) & (uint)fVar11);
        }
        local_118 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                           (uint)fVar14 & -(uint)(scale_min == 3.4028235e+38));
        local_138 = (float)(~-(uint)(scale_max == 3.4028235e+38) & (uint)scale_max |
                           (uint)fVar15 & -(uint)(scale_max == 3.4028235e+38));
      }
      IVar5 = GetColorU32(7,1.0);
      p_max.y = fStack_194;
      p_max.x = fVar17;
      RenderFrame(IVar13,p_max,IVar5,true,(pIVar3->Style).FrameRounding);
      iVar8 = (int)local_198;
      if (values_count <= (int)local_198) {
        iVar8 = values_count;
      }
      iVar7 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
      bVar4 = IsHovered(&inner_bb,0,false);
      if (bVar4) {
        fVar15 = ((pIVar3->IO).MousePos.x - fVar19) / (local_98 - fVar19);
        fVar14 = 0.9999;
        if (fVar15 <= 0.9999) {
          fVar14 = fVar15;
        }
        local_180 = (uint)((float)(~-(uint)(fVar15 < 0.0) & (uint)fVar14) * (float)iVar7);
        if (((int)local_180 < 0) || (values_count <= (int)local_180)) {
          __assert_fail("v_idx >= 0 && v_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bb1,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar14 = (*values_getter)(data,(int)(local_180 + values_offset) % values_count);
        (*values_getter)(data,(int)(local_180 + values_offset + 1) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)local_180,(ulong)(local_180 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar14,(ulong)local_180);
        }
      }
      else {
        local_180 = 0xffffffff;
      }
      local_f8 = (float)iVar7;
      local_98 = local_98 - fVar19;
      iVar8 = iVar8 - (uint)(plot_type == ImGuiPlotType_Lines);
      fVar14 = (*values_getter)(data,values_offset % values_count);
      fVar15 = (fVar14 - local_118) / (local_138 - local_118);
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x25,1.0);
      IVar6 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
      fVar16 = (fStack_194 - fVar16) - fVar18;
      iVar7 = 0;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      fVar11 = 0.0;
      fVar14 = (float)(-(uint)(fVar15 < 0.0) & 0x3f800000 |
                      ~-(uint)(fVar15 < 0.0) & (uint)(1.0 - fVar14));
      while (bVar4 = iVar7 != 0, iVar7 = iVar7 + -1, bVar4) {
        uVar9 = (uint)(fVar11 * local_f8 + 0.5);
        if (((int)uVar9 < 0) || (values_count <= (int)uVar9)) {
          __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bc9,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar12 = 1.0 / (float)iVar8 + fVar11;
        fVar15 = (*values_getter)(data,(int)(uVar9 + values_offset + 1) % values_count);
        fVar21 = (fVar15 - local_118) / (local_138 - local_118);
        fVar15 = 1.0;
        if (fVar21 <= 1.0) {
          fVar15 = fVar21;
        }
        fVar15 = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar15));
        fVar23 = fVar11 * local_98 + fVar19;
        pos0.y = fVar14 * fVar16 + fVar18;
        pos0.x = fVar23;
        fVar21 = local_98 * fVar12 + fVar19;
        fVar11 = fVar12;
        fVar14 = fVar15;
        if (plot_type == ImGuiPlotType_Lines) {
          pos1.y = fVar16 * fVar15 + fVar18;
          pos1.x = fVar21;
          IVar2 = IVar5;
          if (local_180 == uVar9) {
            IVar2 = IVar6;
          }
          ImDrawList::AddLine(pIVar1->DrawList,&pos0,&pos1,IVar2,1.0);
        }
        else {
          pos1.y = fVar18 + fVar16;
          pos1.x = fVar21;
          if (plot_type == ImGuiPlotType_Histogram) {
            if (fVar23 + 2.0 <= fVar21) {
              pos1.x = fVar21 + -1.0;
            }
            IVar2 = IVar5;
            if (local_180 == uVar9) {
              IVar2 = IVar6;
            }
            ImDrawList::AddRectFilled(pIVar1->DrawList,&pos0,&pos1,IVar2,0.0,0xf);
          }
        }
      }
      if (overlay_text != (char *)0x0) {
        pos0.y = fVar22 + (pIVar3->Style).FramePadding.y;
        pos0.x = fVar20;
        pos1.x = 0.5;
        pos1.y = 0.0;
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&pos1,
                          (ImRect *)0x0);
      }
      if (0.0 < fVar10) {
        IVar13.x = fVar17 + (pIVar3->Style).ItemInnerSpacing.x;
        IVar13.y = fVar18;
        RenderText(IVar13,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, NULL))
        return;

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
    int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

    // Tooltip on hover
    int v_hovered = -1;
    if (IsHovered(inner_bb, 0))
    {
        const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
        const int v_idx = (int)(t * item_count);
        IM_ASSERT(v_idx >= 0 && v_idx < values_count);

        const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
        const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines)
            SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
        else if (plot_type == ImGuiPlotType_Histogram)
            SetTooltip("%d: %8.4g", v_idx, v0);
        v_hovered = v_idx;
    }

    const float t_step = 1.0f / (float)res_w;

    float v0 = values_getter(data, (0 + values_offset) % values_count);
    float t0 = 0.0f;
    ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) / (scale_max - scale_min)) );    // Point in the normalized space of our target rectangle

    const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
    const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

    for (int n = 0; n < res_w; n++)
    {
        const float t1 = t0 + t_step;
        const int v1_idx = (int)(t0 * item_count + 0.5f);
        IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
        const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
        const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) / (scale_max - scale_min)) );

        // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
        ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
        ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, 1.0f));
        if (plot_type == ImGuiPlotType_Lines)
        {
            window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }
        else if (plot_type == ImGuiPlotType_Histogram)
        {
            if (pos1.x >= pos0.x + 2.0f)
                pos1.x -= 1.0f;
            window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }

        t0 = t1;
        tp0 = tp1;
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}